

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.c
# Opt level: O0

void zx_draw(zxspectrum_t *state,zxbox_t *dirty)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  zxbox_t *in_RSI;
  long in_RDI;
  int y;
  uint tmp;
  int linear_y;
  int height;
  int width;
  zxbox_t box;
  zxspectrum_private_t *prv;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint local_34;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x1b78));
  if (in_RSI != (zxbox_t *)0x0) {
    iVar1 = zxbox_exceeds(in_RSI,0x100,0xc0);
    if (iVar1 == 0) {
      if (in_RSI->x0 < 1) {
        local_40 = 0;
      }
      else {
        local_40 = in_RSI->x0;
      }
      if (local_40 < 0xff) {
        if (in_RSI->x0 < 1) {
          local_44 = 0;
        }
        else {
          local_44 = in_RSI->x0;
        }
        local_48 = local_44;
      }
      else {
        local_48 = 0xff;
      }
      if (in_RSI->y0 < 1) {
        local_4c = 0;
      }
      else {
        local_4c = in_RSI->y0;
      }
      if (local_4c < 0xbf) {
        if (in_RSI->y0 < 1) {
          local_50 = 0;
        }
        else {
          local_50 = in_RSI->y0;
        }
        local_54 = local_50;
      }
      else {
        local_54 = 0xbf;
      }
      if (in_RSI->x1 < 2) {
        local_58 = 1;
      }
      else {
        local_58 = in_RSI->x1;
      }
      if (local_58 < 0x100) {
        if (in_RSI->x1 < 2) {
          local_5c = 1;
        }
        else {
          local_5c = in_RSI->x1;
        }
        local_60 = local_5c;
      }
      else {
        local_60 = 0x100;
      }
      if (in_RSI->y1 < 2) {
        local_64 = 1;
      }
      else {
        local_64 = in_RSI->y1;
      }
      if (local_64 < 0xc0) {
        if (in_RSI->y1 < 2) {
          local_68 = 1;
        }
        else {
          local_68 = in_RSI->y1;
        }
        local_6c = local_68;
      }
      else {
        local_6c = 0xc0;
      }
      local_48 = local_48 >> 3;
      iVar1 = (local_60 + 7 >> 3) - local_48;
      uVar2 = 0xc0 - local_6c;
      iVar3 = uVar2 + (local_6c - local_54);
      for (local_34 = uVar2; (int)local_34 < iVar3; local_34 = local_34 + 1) {
        uVar4 = (local_34 ^ (int)local_34 >> 3) & 7;
        uVar4 = local_34 ^ (uVar4 | uVar4 << 3);
        memcpy((void *)(in_RDI + 0x1bb8 + (long)(int)(uVar4 * 0x20 + local_48)),
               (void *)(in_RDI + 0x30 + (long)(int)(uVar4 * 0x20 + local_48)),(long)iVar1);
      }
      for (local_34 = (int)uVar2 >> 3; (int)local_34 < iVar3 + 7 >> 3; local_34 = local_34 + 1) {
        memcpy((void *)(in_RDI + 0x33b8 + (long)(int)(local_34 * 0x20 + local_48)),
               (void *)(in_RDI + 0x1830 + (long)(int)(local_34 * 0x20 + local_48)),(long)iVar1);
      }
      zxbox_union((zxbox_t *)(in_RDI + 0x1ba0),in_RSI,(zxbox_t *)(in_RDI + 0x1ba0));
      goto LAB_00104bb8;
    }
  }
  memcpy((void *)(in_RDI + 0x1bb0),(void *)(in_RDI + 0x28),0x1b08);
  zxbox_maximise((zxbox_t *)(in_RDI + 0x1ba0));
LAB_00104bb8:
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x1b78));
  (**(code **)(in_RDI + 0x1b40))(in_RSI,*(undefined8 *)(in_RDI + 0x1b38));
  return;
}

Assistant:

static void zx_draw(zxspectrum_t *state, const zxbox_t *dirty)
{
  zxspectrum_private_t *prv = (zxspectrum_private_t *) state;

  mutex_lock(prv->lock);

  /* If no dirty rectangle was specified then assume the full screen. */
  if (dirty == NULL || zxbox_exceeds(dirty, SCREEN_WIDTH, SCREEN_HEIGHT))
  {
    /* Entire screen has been modified - copy it all. */
    memcpy(&prv->screen_copy, &prv->pub.screen, sizeof(prv->screen_copy));

    /* Maximise the overall dirty box that zxspectrum_claim_screen() will
     * use. */
    zxbox_maximise(&prv->dirty);
  }
  else
  {
    /* Copy pub.screen's dirty region into the screen copy. */

    zxbox_t box;
    int     width;
    int     height;
    int     linear_y;

    /* Clamp the dirty rectangle to the screen dimensions. */
    box.x0 = CLAMP(dirty->x0, 0, 255);
    box.y0 = CLAMP(dirty->y0, 0, 191);
    box.x1 = CLAMP(dirty->x1, 1, 256);
    box.y1 = CLAMP(dirty->y1, 1, 192);

    /* Divide down the x coordinates to get byte-sized quantities. */
    box.x0 = (box.x0    ) >> 3; /* divide to 0..31 rounding down */
    box.x1 = (box.x1 + 7) >> 3; /* divide to 0..31 rounding up */

    width = box.x1 - box.x0;

    /* Convert y coordinates into screen space - (0,0) is top left. */
    height = box.y1 - box.y0;
    box.y0 = 192 - box.y1;
    box.y1 = box.y0 + height;

    for (linear_y = box.y0; linear_y < box.y1; linear_y++)
    {
      /* Transpose fields using XOR */
      unsigned int tmp = (linear_y ^ (linear_y >> 3)) & 7;
      int          y   = linear_y ^ (tmp | (tmp << 3));

      memcpy(&prv->screen_copy.pixels[y * 32 + box.x0],
             &prv->pub.screen.pixels[y * 32 + box.x0],
             width);
    }

    /* Divide down the y coordinates to get attribute-sized quantities. */
    box.y0 = (box.y0    ) >> 3;
    box.y1 = (box.y1 + 7) >> 3;

    for (linear_y = box.y0; linear_y < box.y1; linear_y++)
    {
      memcpy(&prv->screen_copy.attributes[linear_y * 32 + box.x0],
             &prv->pub.screen.attributes[linear_y * 32 + box.x0],
             width);
    }

    /* Union the overall dirty box that zxspectrum_claim_screen() will use
     * with the outstanding one. */
    zxbox_union(&prv->dirty, dirty, &prv->dirty);
  }

  mutex_unlock(prv->lock);

  prv->config.draw(dirty, prv->config.opaque);
}